

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void bssl::anon_unknown_0::ExpectDefaultVersion
               (uint16_t min_version,uint16_t max_version,_func_SSL_METHOD_ptr *method)

{
  bool bVar1;
  SSL_METHOD *meth;
  pointer psVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_c8;
  Message local_c0;
  uint16_t local_b2;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  uint16_t local_8a;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  string local_70;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  _func_SSL_METHOD_ptr *method_local;
  uint16_t max_version_local;
  uint16_t min_version_local;
  
  method_local._4_2_ = max_version;
  method_local._6_2_ = min_version;
  meth = (SSL_METHOD *)(*method)();
  psVar2 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_30,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_30,(AssertionResult *)0x4d86cd,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x3c2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(local_48);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_8a = SSL_CTX_get_min_proto_version(psVar2);
    testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
              ((EqHelper *)local_88,"min_version","SSL_CTX_get_min_proto_version(ctx.get())",
               (unsigned_short *)((long)&method_local + 6),&local_8a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x3c3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_b2 = SSL_CTX_get_max_proto_version(psVar2);
    testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
              ((EqHelper *)local_b0,"max_version","SSL_CTX_get_max_proto_version(ctx.get())",
               (unsigned_short *)((long)&method_local + 4),&local_b2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x3c4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      testing::Message::~Message(&local_c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

static void ExpectDefaultVersion(uint16_t min_version, uint16_t max_version,
                                 const SSL_METHOD *(*method)(void)) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(method()));
  ASSERT_TRUE(ctx);
  EXPECT_EQ(min_version, SSL_CTX_get_min_proto_version(ctx.get()));
  EXPECT_EQ(max_version, SSL_CTX_get_max_proto_version(ctx.get()));
}